

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testinplacetext.cpp
# Opt level: O2

void __thiscall
Am_Button_Text_Info::Get_Info
          (Am_Button_Text_Info *this,int *offset_x,int *offset_y,Am_String *string,Am_Style *style,
          Am_Font *font,Am_Value_List *changing_slots)

{
  char cVar1;
  int width;
  int height;
  Am_Button_Type but_type;
  int iVar2;
  Am_Value *pAVar3;
  char *string_00;
  undefined8 uVar4;
  Am_Style *pAVar5;
  ushort uVar6;
  int in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff78;
  Am_Object in_stack_ffffffffffffff80;
  Am_Widget_Look look;
  Am_Value value;
  int text_height;
  int text_width;
  anon_union_8_8_ea4c8939_for_value local_38;
  
  value.type = 0;
  value.value.wrapper_value = (Am_Wrapper *)0x0;
  uVar6 = (ushort)&this->self;
  pAVar3 = (Am_Value *)Am_Object::Get(uVar6,0x1ae);
  Am_Value::operator=(&value,pAVar3);
  if (value.type != 0xa001) {
    if (value.type != 0x8008) {
      uVar4 = Am_Error("String slot of widget should have string or object value");
      Am_Font::~Am_Font((Am_Font *)&stack0xffffffffffffff78);
      Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff80);
      Am_Value::~Am_Value(&value);
      _Unwind_Resume(uVar4);
    }
    Am_String::operator=(string,&value);
    pAVar3 = (Am_Value *)Am_Object::Get(uVar6,0xcc);
    cVar1 = Am_Value::operator_cast_to_bool(pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get(uVar6,0xac);
    Am_Font::operator=(font,pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get(uVar6,0x66);
    width = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get(uVar6,0x67);
    height = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get(uVar6,0x97);
    but_type = Am_Value::operator_cast_to_int(pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get(uVar6,0x17f);
    iVar2 = Am_Value::operator_cast_to_int(pAVar3);
    text_width._0_2_ = 2;
    local_38 = (anon_union_8_8_ea4c8939_for_value)(long)iVar2;
    Am_Widget_Look::Am_Widget_Look(&look,(Am_Value *)&text_width);
    Am_Value::~Am_Value((Am_Value *)&text_width);
    if (look.value == Am_MOTIF_LOOK.value) {
      Am_Object::Am_Object((Am_Object *)&stack0xffffffffffffff80,&this->self);
      string_00 = Am_String::operator_cast_to_char_(string);
      Am_Font::Am_Font((Am_Font *)&stack0xffffffffffffff78,font);
      Am_Motif_Button_Text_Info
                ((Am_Object *)&stack0xffffffffffffff80,width,height,string_00,
                 (Am_Font *)&stack0xffffffffffffff78,but_type,(int)offset_x,(int)offset_y,
                 SUB81((Am_Value *)&text_width,0),(int)&text_height,in_stack_ffffffffffffff68,
                 (int *)CONCAT17(cVar1,in_stack_ffffffffffffff70),in_stack_ffffffffffffff78,
                 (int *)in_stack_ffffffffffffff80.data,(int *)CONCAT44(height,but_type));
      Am_Font::~Am_Font((Am_Font *)&stack0xffffffffffffff78);
      Am_Object::~Am_Object((Am_Object *)&stack0xffffffffffffff80);
      if (cVar1 == '\0') {
        pAVar5 = (Am_Style *)&Am_Motif_Inactive_Stipple;
      }
      else {
        pAVar5 = (Am_Style *)&Am_Black;
      }
      Am_Style::operator=(style,pAVar5);
    }
    Am_Value_List::operator=(changing_slots,&this->slot_list);
  }
  Am_Value::~Am_Value(&value);
  return;
}

Assistant:

void Get_Info(int &offset_x, int &offset_y, Am_String &string,
                Am_Style &style, Am_Font &font, Am_Value_List &changing_slots) override
  {
    // now find the contents to draw in the button
    Am_Value value;
    // string slot contains a formula which gets the real object based on the
    // value of the COMMAND slot
    value = self.Peek(Am_REAL_STRING_OR_OBJ);
    if (value.type == Am_STRING)
      string = value;
    else if (value.type == Am_OBJECT)
      return;
    else
      Am_Error("String slot of widget should have string or object value");

    bool active = self.Get(Am_ACTIVE);

    font = self.Get(Am_FONT);

    // find out where the string lives inside the button.
    int width = self.Get(Am_WIDTH);
    int height = self.Get(Am_HEIGHT);
    int align = self.Get(Am_H_ALIGN);
    Am_Widget_Look look = (Am_Widget_Look)(int)self.Get(Am_WIDGET_LOOK);

    int text_width, text_height;

    if (look == Am_MOTIF_LOOK) {
      Am_Motif_Button_Text_Info(self, width, height, string, font,
                                Am_PUSH_BUTTON, 0, 0, false, align, 0, offset_x,
                                offset_y, text_width, text_height);
      style = (active ? Am_Black : Am_Motif_Inactive_Stipple);
    }

    changing_slots = slot_list;
  }